

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

string * pbrt::ToString_abi_cxx11_(BxDFReflTransFlags flags)

{
  int iVar1;
  BxDFReflTransFlags in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *s;
  undefined4 in_stack_fffffffffffffff0;
  string *__s;
  
  if (in_ESI == Unset) {
    __s = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (unaff_retaddr,(char *)__s,
               (allocator<char> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    iVar1 = operator&(in_ESI,Reflection);
    if (iVar1 != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"Reflection,");
    }
    iVar1 = operator&(in_ESI,Transmission);
    if (iVar1 != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"Transmission,");
    }
  }
  return in_RDI;
}

Assistant:

std::string ToString(BxDFReflTransFlags flags) {
    if (flags == BxDFReflTransFlags::Unset)
        return "Unset";
    std::string s;
    if (flags & BxDFReflTransFlags::Reflection)
        s += "Reflection,";
    if (flags & BxDFReflTransFlags::Transmission)
        s += "Transmission,";
    return s;
}